

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O2

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  string *psVar2;
  size_t s;
  bool bVar3;
  string local_4260;
  ifstream fin;
  size_t local_4238;
  byte abStack_4220 [488];
  char buffer [16384];
  
  std::ifstream::ifstream(&fin,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(_fin + -0x18)] & 5) == 0) {
    do {
      bVar3 = size == 0;
      if (bVar3) goto LAB_00130acd;
      s = 0x4000;
      if (size < 0x4000) {
        s = size;
      }
      std::istream::read((char *)&fin,(long)buffer);
      if (local_4238 != s) {
        psVar2 = &this->Error;
        std::__cxx11::string::assign((char *)psVar2);
        std::__cxx11::string::append((char *)psVar2);
        std::__cxx11::string::append((char *)psVar2);
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        std::__cxx11::string::append((string *)psVar2);
        goto LAB_00130ac3;
      }
      sVar1 = archive_write_data(this->Archive,buffer,s);
      size = size - s;
    } while (sVar1 == s);
    std::__cxx11::string::assign((char *)&this->Error);
    cm_archive_error_string_abi_cxx11_(&local_4260,this->Archive);
    std::__cxx11::string::append((string *)&this->Error);
LAB_00130ac3:
    std::__cxx11::string::~string((string *)&local_4260);
  }
  else {
    psVar2 = &this->Error;
    std::__cxx11::string::assign((char *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    std::__cxx11::string::append((char *)psVar2);
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::__cxx11::string::append((string *)psVar2);
    std::__cxx11::string::~string((string *)buffer);
    bVar3 = false;
  }
LAB_00130acd:
  std::ifstream::~ifstream(&fin);
  return bVar3;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if(!fin)
    {
    this->Error = "Error opening \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }

  char buffer[16384];
  size_t nleft = size;
  while(nleft > 0)
    {
    typedef std::streamsize ssize_type;
    size_t const nnext = nleft > sizeof(buffer)? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if(static_cast<size_t>(fin.gcount()) != nnext)
      {
      break;
      }
    if(archive_write_data(this->Archive, buffer, nnext) != nnext_s)
      {
      this->Error = "archive_write_data: ";
      this->Error += cm_archive_error_string(this->Archive);
      return false;
      }
    nleft -= nnext;
    }
  if(nleft > 0)
    {
    this->Error = "Error reading \"";
    this->Error += file;
    this->Error += "\": ";
    this->Error += cmSystemTools::GetLastSystemError();
    return false;
    }
  return true;
}